

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O3

Lazy<bool> __thiscall coro_io::period_timer::async_await(period_timer *this)

{
  service_type *psVar1;
  _func_int **in_RSI;
  
  psVar1 = (service_type *)operator_new(0x70,(nothrow_t *)&std::nothrow);
  if (psVar1 == (service_type *)0x0) {
    (this->super_steady_timer).impl_.service_ = (service_type *)0x0;
  }
  else {
    (psVar1->
    super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
    ).super_service._vptr_service = (_func_int **)async_await;
    (psVar1->
    super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
    ).super_service.key_.type_info_ = (type_info *)async_await;
    psVar1[1].
    super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
    .super_service._vptr_service = in_RSI;
    (psVar1->
    super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
    ).super_service.key_.id_ = (id *)0x0;
    (psVar1->
    super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
    ).super_service.owner_ = (execution_context *)0x0;
    (psVar1->
    super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
    ).super_service.next_ = (service *)0x0;
    *(undefined1 *)&(psVar1->timer_queue_).super_timer_queue_base.next_ = 0;
    (this->super_steady_timer).impl_.service_ = psVar1;
    *(undefined1 *)
     &psVar1[1].
      super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
      .super_service.key_.type_info_ = 0;
  }
  return (LazyBase<bool,_false>)(LazyBase<bool,_false>)this;
}

Assistant:

async_simple::coro::Lazy<bool> async_await() noexcept {
    callback_awaitor<bool> awaitor;

    co_return co_await awaitor.await_resume([&](auto handler) {
      this->async_wait([&, handler](const auto &ec) {
        handler.set_value_then_resume(!ec);
      });
    });
  }